

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles2::Functional::eval_distance_vec4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float sqSum;
  float fVar2;
  Vector<float,_4> res;
  float local_18 [4];
  
  local_18[0] = c->in[0].m_data[1] - c->in[1].m_data[3];
  local_18[1] = c->in[0].m_data[2] - c->in[1].m_data[2];
  local_18[2] = c->in[0].m_data[3] - c->in[1].m_data[1];
  local_18[3] = c->in[0].m_data[0] - c->in[1].m_data[0];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_18[lVar1] * local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }